

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

char * try_fmt(char *src,int exp,char *fmt,char *typesrc,char type)

{
  undefined1 in_CL;
  undefined7 in_register_00000009;
  char *in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  undefined1 in_R8B;
  int rd;
  int local_30;
  undefined1 local_29;
  undefined1 *local_28;
  char *local_20;
  int local_14;
  char *local_8;
  
  local_28 = (undefined1 *)CONCAT71(in_register_00000009,in_CL);
  local_30 = 0;
  local_29 = in_R8B;
  local_20 = in_RDX;
  local_14 = in_ESI;
  __isoc99_sscanf(in_RDI,in_RDX,&local_30);
  if (local_30 == local_14) {
    *local_28 = local_29;
    local_8 = local_20;
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

static const char* try_fmt(const char* src, int exp, const char* fmt,
                           char* typesrc, char type)
{
    int rd = 0;
    sscanf(src, fmt, &rd);
    if(rd == exp)
    {
        *typesrc = type;
        return fmt;
    }
    else
        return NULL;
}